

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O0

Translation_Data *
get_translation_data(Map *types,Linkage *internal_linkage,Linkage *external_linkage)

{
  Translation_Data *pTVar1;
  Queue *pQVar2;
  Map *pMVar3;
  Translation_Data *ret;
  Linkage *external_linkage_local;
  Linkage *internal_linkage_local;
  Map *types_local;
  
  pTVar1 = (Translation_Data *)malloc(0x40);
  pQVar2 = (Queue *)malloc(0x18);
  pTVar1->tokens = pQVar2;
  pQVar2 = (Queue *)malloc(0x18);
  pTVar1->errors = pQVar2;
  pQVar2 = (Queue *)malloc(0x18);
  pTVar1->source_files = pQVar2;
  Queue_Init(pTVar1->tokens);
  Queue_Init(pTVar1->errors);
  Queue_Init(pTVar1->source_files);
  pMVar3 = (Map *)malloc(0x810);
  pTVar1->macros = pMVar3;
  Map_Init(pTVar1->macros);
  pTVar1->types = types;
  pTVar1->number_of_errors_when_last_checked = 0;
  pTVar1->external_linkage = external_linkage;
  pTVar1->internal_linkage = internal_linkage;
  return pTVar1;
}

Assistant:

struct Translation_Data* get_translation_data(struct Map *types,struct Linkage *internal_linkage,struct Linkage *external_linkage)
{
	struct Translation_Data *ret;
	ret=malloc(sizeof(struct Translation_Data));
	ret->tokens=malloc(sizeof(struct Queue));
	ret->errors=malloc(sizeof(struct Queue));
	ret->source_files=malloc(sizeof(struct Queue));
	Queue_Init(ret->tokens);
	Queue_Init(ret->errors);
	Queue_Init(ret->source_files);

	ret->macros=malloc(sizeof(struct Map));
	Map_Init(ret->macros);

	ret->types=types;

	ret->number_of_errors_when_last_checked=0;

	ret->external_linkage=external_linkage;
	ret->internal_linkage=internal_linkage;

	return ret;
}